

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int ltf8_get(char *cp,int64_t *val_p)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uchar *up;
  
  bVar1 = *cp;
  uVar4 = (ulong)bVar1;
  if ((char)bVar1 < '\0') {
    uVar3 = (uint)bVar1;
    if (bVar1 < 0xc0) {
      uVar4 = (ulong)((uVar3 & 0x3f) << 8) | (ulong)(byte)cp[1];
      iVar2 = 2;
    }
    else if (bVar1 < 0xe0) {
      uVar4 = (ulong)((uVar3 & 0x1f) << 0x10 | (uint)(byte)cp[1] << 8) | (ulong)(byte)cp[2];
      iVar2 = 3;
    }
    else if (bVar1 < 0xf0) {
      uVar4 = (ulong)((uVar3 & 0xf) << 0x18 | (uint)(byte)cp[1] << 0x10 | (uint)(byte)cp[2] << 8) |
              (ulong)(byte)cp[3];
      iVar2 = 4;
    }
    else if (bVar1 < 0xf8) {
      uVar4 = (ulong)(uVar3 & 7) << 0x20 | (ulong)(byte)cp[1] << 0x18 | (ulong)(byte)cp[2] << 0x10 |
              (ulong)(byte)cp[3] << 8 | (ulong)(byte)cp[4];
      iVar2 = 5;
    }
    else if (bVar1 < 0xfc) {
      uVar4 = (ulong)(uVar3 & 3) << 0x28 | (ulong)(byte)cp[1] << 0x20 | (ulong)(byte)cp[2] << 0x18 |
              (ulong)(byte)cp[3] << 0x10 | (ulong)(byte)cp[4] << 8 | (ulong)(byte)cp[5];
      iVar2 = 6;
    }
    else if (bVar1 < 0xfe) {
      uVar4 = (ulong)(uVar3 & 1) << 0x30 | (ulong)(byte)cp[1] << 0x28 | (ulong)(byte)cp[2] << 0x20 |
              (ulong)(byte)cp[3] << 0x18 | (ulong)(byte)cp[4] << 0x10 | (ulong)(byte)cp[5] << 8 |
              (ulong)(byte)cp[6];
      iVar2 = 7;
    }
    else if (uVar3 == 0xff) {
      uVar4 = (ulong)(byte)cp[8] |
              (ulong)(byte)cp[7] << 8 |
              (ulong)(byte)cp[6] << 0x10 |
              (ulong)(byte)cp[5] << 0x18 |
              (ulong)(byte)cp[4] << 0x20 |
              (ulong)(byte)cp[3] << 0x28 | (ulong)(byte)cp[2] << 0x30 | (ulong)(byte)cp[1] << 0x38;
      iVar2 = 9;
    }
    else {
      uVar4 = (ulong)(byte)cp[7] |
              (ulong)(byte)cp[6] << 8 |
              (ulong)(byte)cp[5] << 0x10 |
              (ulong)(byte)cp[4] << 0x18 |
              (ulong)(byte)cp[3] << 0x20 | (ulong)(byte)cp[2] << 0x28 | (ulong)(byte)cp[1] << 0x30;
      iVar2 = 8;
    }
  }
  else {
    iVar2 = 1;
  }
  *val_p = uVar4;
  return iVar2;
}

Assistant:

int ltf8_get(char *cp, int64_t *val_p) {
    unsigned char *up = (unsigned char *)cp;
    
    if (up[0] < 0x80) {
	*val_p =   up[0];
	return 1;
    } else if (up[0] < 0xc0) {
	*val_p = (((uint64_t)up[0]<< 8) |
		   (uint64_t)up[1]) & (((1LL<<(6+8)))-1);
	return 2;
    } else if (up[0] < 0xe0) {
	*val_p = (((uint64_t)up[0]<<16) |
		  ((uint64_t)up[1]<< 8) |
		   (uint64_t)up[2]) & ((1LL<<(5+2*8))-1);
	return 3;
    } else if (up[0] < 0xf0) {
	*val_p = (((uint64_t)up[0]<<24) |
		  ((uint64_t)up[1]<<16) |
		  ((uint64_t)up[2]<< 8) |
		   (uint64_t)up[3]) & ((1LL<<(4+3*8))-1);
	return 4;
    } else if (up[0] < 0xf8) {
	*val_p = (((uint64_t)up[0]<<32) |
		  ((uint64_t)up[1]<<24) |
		  ((uint64_t)up[2]<<16) |
		  ((uint64_t)up[3]<< 8) |
		   (uint64_t)up[4]) & ((1LL<<(3+4*8))-1);
	return 5;
    } else if (up[0] < 0xfc) {
	*val_p = (((uint64_t)up[0]<<40) |
		  ((uint64_t)up[1]<<32) |
		  ((uint64_t)up[2]<<24) |
		  ((uint64_t)up[3]<<16) |
		  ((uint64_t)up[4]<< 8) |
		   (uint64_t)up[5]) & ((1LL<<(2+5*8))-1);
	return 6;
    } else if (up[0] < 0xfe) {
	*val_p = (((uint64_t)up[0]<<48) |
		  ((uint64_t)up[1]<<40) |
		  ((uint64_t)up[2]<<32) |
		  ((uint64_t)up[3]<<24) |
		  ((uint64_t)up[4]<<16) |
		  ((uint64_t)up[5]<< 8) |
		   (uint64_t)up[6]) & ((1LL<<(1+6*8))-1);
	return 7;
    } else if (up[0] < 0xff) {
	*val_p = (((uint64_t)up[1]<<48) |
		  ((uint64_t)up[2]<<40) |
		  ((uint64_t)up[3]<<32) |
		  ((uint64_t)up[4]<<24) |
		  ((uint64_t)up[5]<<16) |
		  ((uint64_t)up[6]<< 8) |
		   (uint64_t)up[7]) & ((1LL<<(7*8))-1);
	return 8;
    } else {
	*val_p = (((uint64_t)up[1]<<56) |
		  ((uint64_t)up[2]<<48) |
		  ((uint64_t)up[3]<<40) |
		  ((uint64_t)up[4]<<32) |
		  ((uint64_t)up[5]<<24) |
		  ((uint64_t)up[6]<<16) |
		  ((uint64_t)up[7]<< 8) |
		   (uint64_t)up[8]);
	return 9;
    }
}